

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void update_call_arg_area_offset(c2m_ctx_t c2m_ctx,type *type,int update_scope_p)

{
  ulong uVar1;
  check_ctx *pcVar2;
  void *pvVar3;
  node_t pnVar4;
  mir_size_t mVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  pcVar2 = c2m_ctx->check_ctx;
  pnVar4 = (pcVar2->curr_func_def->u).ops.head;
  iVar6 = -2;
  do {
    pnVar4 = (pnVar4->op_link).next;
    if (pnVar4 == (node_t)0x0) break;
    bVar8 = iVar6 != 0;
    iVar6 = iVar6 + 1;
  } while (bVar8);
  pvVar3 = pnVar4->attr;
  mVar5 = raw_type_size(c2m_ctx,type);
  uVar7 = (ulong)type->align;
  if (uVar7 != 0) {
    uVar1 = (mVar5 - 1) + uVar7;
    mVar5 = uVar1 - uVar1 % uVar7;
  }
  uVar7 = (mVar5 + 0xf & 0xfffffffffffffff0) + pcVar2->curr_call_arg_area_offset;
  pcVar2->curr_call_arg_area_offset = uVar7;
  if ((update_scope_p != 0) && (*(ulong *)((long)pvVar3 + 0x18) < uVar7)) {
    *(ulong *)((long)pvVar3 + 0x18) = uVar7;
  }
  return;
}

Assistant:

static void update_call_arg_area_offset (c2m_ctx_t c2m_ctx, struct type *type, int update_scope_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  node_t block = NL_EL (curr_func_def->u.ops, 3);
  struct node_scope *ns = block->attr;

  curr_call_arg_area_offset += round_size (type_size (c2m_ctx, type), MAX_ALIGNMENT);
  if (update_scope_p && ns->call_arg_area_size < curr_call_arg_area_offset)
    ns->call_arg_area_size = curr_call_arg_area_offset;
}